

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O3

Promise<void> __thiscall
capnproto_test::capnp::test::TestCallOrder::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  PromiseNode *extraout_RDX;
  undefined6 in_register_00000032;
  Promise<void> PVar3;
  PromiseNode *pPVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  if ((int)context.hook == 0) {
    (**(code **)(lVar1 + 8))(this);
    pPVar2 = extraout_RDX;
  }
  else {
    PVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x3065ce,0x51);
    pPVar2 = PVar3.super_PromiseBase.node.ptr;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestCallOrder::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return getCallSequence(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,  ::capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestCallOrder",
          0xa0e77035bdff0051ull, methodId);
  }
}